

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O1

int Signal::produceAudio(double *in,int inLength,short **out,int *outLength,double volume)

{
  int iVar1;
  short *psVar2;
  ulong uVar3;
  short sVar4;
  
  if (in == (double *)0x0) {
    puts("Input buffer is NULL! Aborting audio samples production...");
    iVar1 = -1;
  }
  else {
    *outLength = inLength;
    if (*out == (short *)0x0) {
      psVar2 = (short *)malloc((long)(inLength * 2) * 2);
      *out = psVar2;
    }
    if (inLength < 1) {
      iVar1 = 0;
    }
    else {
      psVar2 = *out;
      iVar1 = 0;
      uVar3 = 0;
      do {
        sVar4 = (short)(int)(in[uVar3] * volume * 32767.0);
        psVar2[uVar3 * 2 + 1] = sVar4;
        psVar2[uVar3 * 2] = sVar4;
        uVar3 = uVar3 + 1;
      } while ((uint)inLength != uVar3);
    }
  }
  return iVar1;
}

Assistant:

int Signal::produceAudio(double * in, int inLength, short ** out, int * outLength, double volume)
{
    int i;

    // Return error if input signal is empty
    if (in == NULL)
    {
    	printf("Input buffer is NULL! Aborting audio samples production...\n");
    	return -1;
    }

    // Output length is the same as input length
    *outLength = inLength;

    // If the output signal is not allocated, allocate it
    if (*out == NULL)
    {
    	*out = (short *) malloc(2 * (*outLength) * sizeof(short));
    }

    // Produce the final audio signal
    for (i = 0; i < *outLength; i++)
    {
        (*out)[2 * i] = (*out)[2 * i + 1] = (short) (in[i] * volume * 32767);
    }

    return 0;
}